

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnu_gettext.h
# Opt level: O2

void __thiscall booster::locale::gnu_gettext::messages_info::~messages_info(messages_info *this)

{
  std::_Function_base::~_Function_base(&(this->callback).super__Function_base);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->paths);
  std::
  vector<booster::locale::gnu_gettext::messages_info::domain,_std::allocator<booster::locale::gnu_gettext::messages_info::domain>_>
  ::~vector(&this->domains);
  std::__cxx11::string::~string((string *)&this->locale_category);
  std::__cxx11::string::~string((string *)&this->encoding);
  std::__cxx11::string::~string((string *)&this->variant);
  std::__cxx11::string::~string((string *)&this->country);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

messages_info() :
            language("C"),
            locale_category("LC_MESSAGES")
        {
        }